

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

SQInteger __thiscall
SQClass::Next(SQClass *this,SQObjectPtr *refpos,SQObjectPtr *outkey,SQObjectPtr *outval)

{
  SQObjectPtr *pSVar1;
  SQClassMember *pSVar2;
  SQObjectPtr *in_RDI;
  SQObjectPtr *o;
  SQInteger idx;
  SQObjectPtr oval;
  SQObjectPtr *in_stack_ffffffffffffff78;
  SQObjectPtr *in_stack_ffffffffffffff80;
  SQObjectPtr *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined1 getweakrefs;
  SQTable *in_stack_ffffffffffffffa8;
  SQObjectPtr local_30 [3];
  
  getweakrefs = (undefined1)((ulong)in_stack_ffffffffffffffa0 >> 0x38);
  pSVar1 = local_30;
  ::SQObjectPtr::SQObjectPtr(pSVar1);
  pSVar1 = (SQObjectPtr *)
           SQTable::Next(in_stack_ffffffffffffffa8,(bool)getweakrefs,in_stack_ffffffffffffff98,
                         pSVar1,in_RDI);
  if (pSVar1 != (SQObjectPtr *)0xffffffffffffffff) {
    if ((local_30[0].super_SQObject._unVal.nInteger & 0x1000000U) == 0) {
      pSVar2 = sqvector<SQClassMember>::operator[]
                         ((sqvector<SQClassMember> *)(in_RDI + 4),
                          (ulong)(local_30[0].super_SQObject._unVal._0_4_ & 0xffffff));
      ::SQObjectPtr::operator=(in_stack_ffffffffffffff80,(SQObject *)pSVar2);
    }
    else {
      pSVar2 = sqvector<SQClassMember>::operator[]
                         ((sqvector<SQClassMember> *)&in_RDI[5].super_SQObject._unVal,
                          (ulong)(local_30[0].super_SQObject._unVal._0_4_ & 0xffffff));
      ::SQObjectPtr::operator=(&pSVar2->val,in_stack_ffffffffffffff78);
    }
  }
  ::SQObjectPtr::~SQObjectPtr(pSVar1);
  return (SQInteger)pSVar1;
}

Assistant:

SQInteger SQClass::Next(const SQObjectPtr &refpos, SQObjectPtr &outkey, SQObjectPtr &outval)
{
    SQObjectPtr oval;
    SQInteger idx = _members->Next(false,refpos,outkey,oval);
    if(idx != -1) {
        if(_ismethod(oval)) {
            outval = _methods[_member_idx(oval)].val;
        }
        else {
            SQObjectPtr &o = _defaultvalues[_member_idx(oval)].val;
            outval = _realval(o);
        }
    }
    return idx;
}